

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O0

holder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
cs::
allocator_type<cs_impl::any::holder<std::__cxx11::string>,64ul,cs_impl::default_allocator_provider>
::alloc<std::__cxx11::string>
          (allocator_type<cs_impl::any::holder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_64UL,_cs_impl::default_allocator_provider>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  long lVar1;
  __int_type_conflict _Var2;
  holder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *phVar3;
  new_allocator<cs_impl::any::holder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RSI;
  new_allocator<cs_impl::any::holder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  holder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *ptr;
  holder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffffd8;
  size_type __n;
  
  __n = 0;
  if (*(long *)(in_RDI + 0x208) != 0) {
    _Var2 = std::__atomic_base::operator_cast_to_unsigned_long((__atomic_base<unsigned_long> *)0x0);
    if (_Var2 == 0) {
      lVar1 = *(long *)(in_RDI + 0x208);
      *(long *)(in_RDI + 0x208) = lVar1 + -1;
      phVar3 = *(holder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 **)(in_RDI + lVar1 * 8 + -8);
      goto LAB_001d45b2;
    }
  }
  phVar3 = __gnu_cxx::
           new_allocator<cs_impl::any::holder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::allocate(in_RSI,__n,in_RDI);
LAB_001d45b2:
  __gnu_cxx::new_allocator<cs_impl::any::holder<std::__cxx11::string>>::
  construct<cs_impl::any::holder<std::__cxx11::string>,std::__cxx11::string>
            (in_RDI,in_stack_ffffffffffffffd8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1d45cd);
  return phVar3;
}

Assistant:

inline T *alloc(ArgsT &&...args)
		{
			T *ptr = nullptr;
			if (mOffset > 0 && global_thread_counter == 0)
				ptr = mPool[--mOffset];
			else
				ptr = mAlloc.allocate(1);
			mAlloc.construct(ptr, std::forward<ArgsT>(args)...);
			return ptr;
		}